

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O0

string * __thiscall
t_dart_generator::get_file_name(string *__return_storage_ptr__,t_dart_generator *this,string *name)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  uint local_38;
  char lc;
  uint i;
  bool is_next_lc;
  bool is_current_lc;
  bool is_prev_lc;
  char *tmp;
  string *name_local;
  t_dart_generator *this_local;
  string *ret;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  pcVar6 = (char *)std::__cxx11::string::c_str();
  cVar1 = *pcVar6;
  iVar4 = tolower((int)*pcVar6);
  bVar2 = true;
  bVar3 = cVar1 == iVar4;
  for (local_38 = 0; uVar7 = std::__cxx11::string::length(), local_38 < uVar7;
      local_38 = local_38 + 1) {
    iVar4 = tolower((int)pcVar6[local_38]);
    lVar8 = std::__cxx11::string::length();
    if ((ulong)local_38 == lVar8 - 1U) {
      bVar9 = false;
    }
    else {
      cVar1 = pcVar6[local_38 + 1];
      iVar5 = tolower((int)pcVar6[local_38 + 1]);
      bVar9 = cVar1 == iVar5;
    }
    if (((local_38 != 0) && (!bVar3)) && ((bVar2 || (bVar9)))) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"_");
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(char)iVar4);
    bVar2 = bVar3;
    bVar3 = bVar9;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string t_dart_generator::get_file_name(std::string name) {
  // e.g. change APIForFileIO to api_for_file_io

  string ret;
  const char* tmp = name.c_str();
  bool is_prev_lc = true;
  bool is_current_lc = tmp[0] == tolower(tmp[0]);
  bool is_next_lc = false;

  for (unsigned int i = 0; i < name.length(); i++) {
    char lc = tolower(tmp[i]);

    if (i == name.length() - 1) {
      is_next_lc = false;
    } else {
      is_next_lc = (tmp[i+1] == tolower(tmp[i+1]));
    }

    if (i != 0 && !is_current_lc && (is_prev_lc || is_next_lc)) {
      ret += "_";
    }
    ret += lc;

    is_prev_lc = is_current_lc;
    is_current_lc = is_next_lc;
  }

  return ret;
}